

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall ON_LineCurve::Reverse(ON_LineCurve *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint p;
  ON_LineCurve *this_local;
  
  dVar1 = (this->m_line).from.x;
  dVar2 = (this->m_line).from.y;
  dVar3 = (this->m_line).from.z;
  (this->m_line).from.x = (this->m_line).to.x;
  (this->m_line).from.y = (this->m_line).to.y;
  (this->m_line).from.z = (this->m_line).to.z;
  (this->m_line).to.x = dVar1;
  (this->m_line).to.y = dVar2;
  (this->m_line).to.z = dVar3;
  ON_Interval::Reverse(&this->m_t);
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return true;
}

Assistant:

bool
ON_LineCurve::Reverse()
{
  const ON_3dPoint p = m_line.from;
  m_line.from = m_line.to;
  m_line.to = p;
  m_t.Reverse();
	DestroyCurveTree();
  return true;
}